

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psbt.cpp
# Opt level: O1

void __thiscall Psbt_SetTxOutOnly_Test::TestBody(Psbt_SetTxOutOnly_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_2;
  Psbt psbt2;
  Amount amount;
  HDWallet wallet2;
  HDWallet wallet1;
  string path2;
  string path1;
  TxOut txout_1;
  Psbt psbt;
  Address addr1;
  Address addr2;
  TxOutReference txout_2r;
  TxOut txout_2;
  KeyData key1;
  KeyData key2;
  undefined1 local_7f8 [32];
  AssertHelper local_7d8;
  _Alloc_hider local_7d0;
  AssertHelper local_7c8;
  Psbt local_7c0;
  Amount local_770;
  HDWallet local_760;
  HDWallet local_748;
  string local_730;
  string local_710;
  TxOut local_6f0;
  Psbt local_6a0;
  undefined1 local_650 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_648;
  _Alloc_hider local_640;
  uchar local_630 [16];
  pointer local_620;
  pointer local_608;
  pointer local_5f0;
  TapBranch local_5d8;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_560;
  Script local_548;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_508;
  Address local_4d8;
  TxOutReference local_360;
  TxOut local_310;
  KeyData local_2c0;
  KeyData local_170;
  
  cfd::core::Psbt::Psbt(&local_6a0);
  local_4d8._0_8_ = (ulong)local_4d8.addr_type_ << 0x20;
  local_2c0.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = cfd::core::Psbt::GetTxOutCount(&local_6a0);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)local_650,"0","psbt.GetTxOutCount()",&local_4d8.type_,(uint *)&local_2c0);
  if (local_650[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_4d8);
    if (local_648.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_648.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x237,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c0,(Message *)&local_4d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4d8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4d8._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_4d8._0_8_ + 8))();
      }
      local_4d8._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_648,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ByteData::ByteData((ByteData *)local_650,&g_psbt_seed1_abi_cxx11_);
  cfd::core::HDWallet::HDWallet(&local_748,(ByteData *)local_650);
  if ((void *)CONCAT71(local_650._1_7_,local_650[0]) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_650._1_7_,local_650[0]));
  }
  cfd::core::ByteData::ByteData((ByteData *)local_650,&g_psbt_seed2_abi_cxx11_);
  cfd::core::HDWallet::HDWallet(&local_760,(ByteData *)local_650);
  if ((void *)CONCAT71(local_650._1_7_,local_650[0]) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_650._1_7_,local_650[0]));
  }
  local_710._M_dataplus._M_p = (pointer)&local_710.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_710,"44h/0h/0h/0/2","");
  local_730._M_dataplus._M_p = (pointer)&local_730.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_730,"44h/0h/0h/0/2","");
  cfd::core::HDWallet::GeneratePubkeyData(&local_2c0,&local_748,kTestnet,&local_710);
  cfd::core::HDWallet::GeneratePubkeyData(&local_170,&local_760,kTestnet,&local_730);
  cfd::core::KeyData::GetPubkey((Pubkey *)&local_4d8,&local_2c0);
  cfd::core::Address::Address
            ((Address *)local_650,kCfdIllegalArgumentError,kVersion0,(Pubkey *)&local_4d8);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4d8._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_4d8._0_8_);
  }
  cfd::core::KeyData::GetPubkey((Pubkey *)&local_6f0,&local_170);
  cfd::core::Address::Address(&local_4d8,kCfdIllegalArgumentError,kVersion0,(Pubkey *)&local_6f0);
  if (local_6f0.super_AbstractTxOut._vptr_AbstractTxOut != (_func_int **)0x0) {
    operator_delete(local_6f0.super_AbstractTxOut._vptr_AbstractTxOut);
  }
  cfd::core::Amount::Amount(&local_770,100000000);
  cfd::core::TxOut::TxOut(&local_6f0,&local_770,(Address *)local_650);
  cfd::core::TxOut::TxOut(&local_310,&local_770,&local_4d8);
  cfd::core::TxOutReference::TxOutReference(&local_360,&local_310);
  cfd::core::Psbt::AddTxOut(&local_6a0,&local_6f0);
  cfd::core::Psbt::AddTxOut(&local_6a0,&local_360);
  local_7f8._0_4_ = 2;
  local_7d8.data_._0_4_ = cfd::core::Psbt::GetTxOutCount(&local_6a0);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_7c0,"2","psbt.GetTxOutCount()",(int *)local_7f8,(uint *)&local_7d8);
  if ((char)local_7c0._vptr_Psbt == '\0') {
    testing::Message::Message((Message *)local_7f8);
    if ((undefined8 *)local_7c0.wally_psbt_pointer_ == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *local_7c0.wally_psbt_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x248,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7d8,(Message *)local_7f8);
    testing::internal::AssertHelper::~AssertHelper(&local_7d8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7f8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_7f8._0_8_ + 8))();
      }
      local_7f8._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_7c0.wally_psbt_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Psbt::GetData((ByteData *)local_7f8,&local_6a0);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&local_7c0,(ByteData *)local_7f8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_7d8,
             "\"70736274ff01004802000000000200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a55500000000000000\""
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff01004802000000000200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a55500000000000000"
             ,(char *)local_7c0._vptr_Psbt);
  if ((Transaction *)local_7c0._vptr_Psbt != &local_7c0.base_tx_) {
    operator_delete(local_7c0._vptr_Psbt);
  }
  if ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_7f8._0_8_);
  }
  if (local_7d8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_7c0);
    if (local_7d0._M_p == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_7d0._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x24a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_7c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
    if (local_7c0._vptr_Psbt != (_func_int **)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_7c0._vptr_Psbt != (_func_int **)0x0)) {
        (**(code **)(*local_7c0._vptr_Psbt + 8))();
      }
      local_7c0._vptr_Psbt = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_7d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Psbt::GetData((ByteData *)local_7f8,&local_6a0);
  cfd::core::Psbt::Psbt(&local_7c0,(ByteData *)local_7f8);
  if ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_7f8._0_8_);
  }
  cfd::core::Psbt::GetBase64_abi_cxx11_((string *)local_7f8,&local_7c0);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_7d8,
             "\"cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAAAA=\""
             ,"psbt2.GetBase64().c_str()",
             "cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAAAA="
             ,(char *)local_7f8._0_8_);
  if ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)(local_7f8 + 0x10)) {
    operator_delete((void *)local_7f8._0_8_);
  }
  if (local_7d8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_7f8);
    if (local_7d0._M_p == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_7d0._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x24c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7c8,(Message *)local_7f8);
    testing::internal::AssertHelper::~AssertHelper(&local_7c8);
    if ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7f8._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_7f8._0_8_ + 8))();
      }
      local_7f8._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_7d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Psbt::~Psbt(&local_7c0);
  local_360.super_AbstractTxOutReference._vptr_AbstractTxOutReference =
       (_func_int **)&PTR__AbstractTxOutReference_00693fb8;
  cfd::core::Script::~Script(&local_360.super_AbstractTxOutReference.locking_script_);
  local_310.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)&PTR__AbstractTxOut_006a6570;
  cfd::core::Script::~Script(&local_310.super_AbstractTxOut.locking_script_);
  local_6f0.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)&PTR__AbstractTxOut_006a6570;
  cfd::core::Script::~Script(&local_6f0.super_AbstractTxOut.locking_script_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_4d8.format_data_);
  cfd::core::Script::~Script(&local_4d8.redeem_script_);
  local_4d8.script_tree_.super_TapBranch._vptr_TapBranch =
       (_func_int **)&PTR__TaprootScriptTree_006a68b0;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&local_4d8.script_tree_.nodes_);
  cfd::core::TapBranch::~TapBranch(&local_4d8.script_tree_.super_TapBranch);
  if (local_4d8.schnorr_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4d8.schnorr_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_4d8.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4d8.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_4d8.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4d8.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8.address_._M_dataplus._M_p != &local_4d8.address_.field_2) {
    operator_delete(local_4d8.address_._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_508);
  cfd::core::Script::~Script(&local_548);
  local_5d8._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_006a68b0;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_560);
  cfd::core::TapBranch::~TapBranch(&local_5d8);
  if (local_5f0 != (pointer)0x0) {
    operator_delete(local_5f0);
  }
  if (local_608 != (pointer)0x0) {
    operator_delete(local_608);
  }
  if (local_620 != (pointer)0x0) {
    operator_delete(local_620);
  }
  if ((uchar *)local_640._M_p != local_630) {
    operator_delete(local_640._M_p);
  }
  cfd::core::KeyData::~KeyData(&local_170);
  cfd::core::KeyData::~KeyData(&local_2c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_730._M_dataplus._M_p != &local_730.field_2) {
    operator_delete(local_730._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_710._M_dataplus._M_p != &local_710.field_2) {
    operator_delete(local_710._M_dataplus._M_p);
  }
  if (local_760.seed_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_760.seed_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_748.seed_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_748.seed_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  cfd::core::Psbt::~Psbt(&local_6a0);
  return;
}

Assistant:

TEST(Psbt, SetTxOutOnly) {
  Psbt psbt;
  EXPECT_EQ(0, psbt.GetTxOutCount());
  
  HDWallet wallet1 = HDWallet(ByteData(g_psbt_seed1));
  HDWallet wallet2 = HDWallet(ByteData(g_psbt_seed2));
  std::string path1 = "44h/0h/0h/0/2";
  std::string path2 = "44h/0h/0h/0/2";
  auto key1 = wallet1.GeneratePubkeyData(NetType::kTestnet, path1);
  auto key2 = wallet2.GeneratePubkeyData(NetType::kTestnet, path2);
  auto addr1 = Address(NetType::kTestnet, WitnessVersion::kVersion0, key1.GetPubkey());
  auto addr2 = Address(NetType::kTestnet, WitnessVersion::kVersion0, key2.GetPubkey());

  Amount amount(100000000);
  TxOut txout_1(amount, addr1);
  TxOut txout_2(amount, addr2);
  TxOutReference txout_2r(txout_2);
  psbt.AddTxOut(txout_1);
  psbt.AddTxOut(txout_2r);
  EXPECT_EQ(2, psbt.GetTxOutCount());

  EXPECT_STREQ("70736274ff01004802000000000200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a55500000000000000", psbt.GetData().GetHex().c_str());
  Psbt psbt2(psbt.GetData());
  EXPECT_STREQ("cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAAAA=", psbt2.GetBase64().c_str());
}